

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

int __thiscall SBarInfo::newImage(SBarInfo *this,char *patchname)

{
  uint uVar1;
  FString *pFVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  FString local_30;
  
  uVar5 = 0xffffffff;
  if (*patchname != '\0') {
    iVar3 = strcasecmp(patchname,"nullimage");
    if (iVar3 != 0) {
      uVar4 = (ulong)(this->Images).Count;
      if (uVar4 != 0) {
        pFVar2 = (this->Images).Array;
        uVar5 = 0;
        do {
          iVar3 = strcasecmp(pFVar2[uVar5].Chars,patchname);
          if (iVar3 == 0) goto LAB_004be940;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      FString::FString(&local_30,patchname);
      TArray<FString,_FString>::Grow(&this->Images,1);
      FString::AttachToOther((this->Images).Array + (this->Images).Count,&local_30);
      uVar1 = (this->Images).Count;
      uVar5 = (ulong)uVar1;
      (this->Images).Count = uVar1 + 1;
      FString::~FString(&local_30);
    }
  }
LAB_004be940:
  return (int)uVar5;
}

Assistant:

int SBarInfo::newImage(const char *patchname)
{
	if(patchname[0] == '\0' || stricmp(patchname, "nullimage") == 0)
	{
		return -1;
	}
	for(unsigned int i = 0;i < this->Images.Size();i++) //did we already load it?
	{
		if(stricmp(this->Images[i], patchname) == 0)
		{
			return i;
		}
	}
	return this->Images.Push(patchname);
}